

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QString * __thiscall
QHash<QFontDatabase::WritingSystem,_QString>::value
          (QString *__return_storage_ptr__,QHash<QFontDatabase::WritingSystem,_QString> *this,
          WritingSystem *key)

{
  Data *pDVar1;
  Node<QFontDatabase::WritingSystem,_QString> *pNVar2;
  QString *pQVar3;
  
  if (this->d != (Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::
             findNode<QFontDatabase::WritingSystem>(this->d,key);
    if (pNVar2 != (Node<QFontDatabase::WritingSystem,_QString> *)0x0) {
      pQVar3 = &pNVar2->value;
      goto LAB_0040f175;
    }
  }
  pQVar3 = (QString *)0x0;
LAB_0040f175:
  if (pQVar3 == (QString *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (pQVar3->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pQVar3->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar3->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }